

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Reg1Unsigned1(ByteCodeWriter *this,OpCode op,RegSlot R0,uint C1)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  bool local_32;
  bool local_31;
  ProfileId local_22;
  OpLayoutType local_20;
  bool success;
  bool isProfiled;
  ProfileId profileId;
  RegSlot local_18;
  uint C1_local;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  _success = C1;
  local_18 = R0;
  C1_local._2_2_ = op;
  _R0_local = this;
  CheckOpen(this);
  op_00 = C1_local._2_2_;
  OpLayoutType::OpLayoutType(&local_20,Reg1Unsigned1);
  CheckOp(this,op_00,local_20);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(C1_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x958,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_18 = ConsumeReg(this,local_18);
  local_22 = 0xffff;
  bVar2 = DoProfileNewScArrayOp(this,C1_local._2_2_);
  if ((bVar2) && (bVar2 = DoDynamicProfileOpcode(this,NativeArrayPhase,true), bVar2)) {
    bVar2 = FunctionBody::AllocProfiledArrayCallSiteId(this->m_functionWrite,&local_22);
    local_31 = true;
    if (bVar2) goto LAB_00c32d6e;
  }
  local_32 = false;
  if (C1_local._2_2_ == InitForInEnumerator) {
    local_32 = FunctionBody::AllocProfiledForInLoopCount(this->m_functionWrite,&local_22);
  }
  local_31 = local_32;
LAB_00c32d6e:
  if (local_31 != false) {
    OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&C1_local + 2));
  }
  bVar2 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,C1_local._2_2_,local_18,_success);
  if (((!bVar2) &&
      (bVar2 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,C1_local._2_2_,local_18,_success), !bVar2)) &&
     (bVar2 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,C1_local._2_2_,local_18,_success), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x967,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (local_31 != false) {
    Data::Encode(&this->m_byteCodeData,&local_22,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg1Unsigned1(OpCode op, RegSlot R0, uint C1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg1Unsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);

        ProfileId profileId = Constants::NoProfileId;
        bool isProfiled = (DoProfileNewScArrayOp(op) &&
            DoDynamicProfileOpcode(NativeArrayPhase, true) &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId))
            || (op == OpCode::InitForInEnumerator &&
                this->m_functionWrite->AllocProfiledForInLoopCount(&profileId));

        if (isProfiled)
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }
        MULTISIZE_LAYOUT_WRITE(Reg1Unsigned1, op, R0, C1);
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }